

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

double mean(double *vec,int N)

{
  double local_20;
  double m;
  int i;
  int N_local;
  double *vec_local;
  
  local_20 = 0.0;
  for (m._0_4_ = 0; m._0_4_ < N; m._0_4_ = m._0_4_ + 1) {
    local_20 = vec[m._0_4_] + local_20;
  }
  return local_20 / (double)N;
}

Assistant:

double mean(double* vec, int N) {
	int i;
	double m;
	m = 0.0;

	for (i = 0; i < N; ++i) {
		m+= vec[i];
	}
	m = m / N;
	return m;
}